

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

Logon * anon_unknown.dwarf_2926b4::createLogon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_198;
  FieldBase local_140;
  HeartBtInt local_e8;
  EncryptMethod local_80;
  undefined1 local_25;
  int local_24;
  char *pcStack_20;
  int seq_local;
  char *target_local;
  char *sender_local;
  Logon *logon;
  
  local_25 = 0;
  local_24 = seq;
  pcStack_20 = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX42::Logon::Logon(__return_storage_ptr__);
  FIX::EncryptMethod::EncryptMethod(&local_80,0);
  FIX42::Logon::set(__return_storage_ptr__,&local_80);
  FIX::EncryptMethod::~EncryptMethod(&local_80);
  FIX::HeartBtInt::HeartBtInt(&local_e8,0x1e);
  FIX42::Logon::set(__return_storage_ptr__,&local_e8);
  FIX::HeartBtInt::~HeartBtInt(&local_e8);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,pcStack_20,local_24);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_140,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_140,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_140);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_198,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_198,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logon createLogon(const char *sender, const char *target, int seq) {
  FIX42::Logon logon;
  logon.set(EncryptMethod(0));
  logon.set(HeartBtInt(30));
  fillHeader(logon.getHeader(), sender, target, seq);
  logon.getHeader().setField(BodyLength(logon.bodyLength()));
  logon.getTrailer().setField(CheckSum(logon.checkSum()));
  return logon;
}